

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall AllocatorTest_allocator_ref_Test::TestBody(AllocatorTest_allocator_ref_Test *this)

{
  bool bVar1;
  mock_allocator<int> *actual_expression;
  AssertionResult gtest_ar;
  test_allocator_ref ref3;
  test_allocator_ref ref2;
  test_allocator_ref ref;
  StrictMock<mock_allocator<int>_> alloc;
  StrictMock<mock_allocator<int>_> *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  mock_allocator<int> *alloc_00;
  int line;
  StrictMock<mock_allocator<int>_> *in_stack_fffffffffffffec0;
  Type in_stack_fffffffffffffecc;
  AssertHelper *in_stack_fffffffffffffed0;
  allocator_ref<mock_allocator<int>_> local_120;
  allocator_ref<mock_allocator<int>_> local_118 [3];
  allocator_ref<mock_allocator<int>_> local_100 [3];
  Message *in_stack_ffffffffffffff18;
  AssertHelper *in_stack_ffffffffffffff20;
  allocator_ref<mock_allocator<int>_> *in_stack_ffffffffffffff58;
  mock_allocator<int> *in_stack_ffffffffffffff60;
  
  testing::StrictMock<mock_allocator<int>_>::StrictMock(in_stack_fffffffffffffec0);
  alloc_00 = (mock_allocator<int> *)0x0;
  if (&stack0x00000000 != (undefined1 *)0xf8) {
    alloc_00 = (mock_allocator<int> *)(local_100 + 2);
  }
  allocator_ref<mock_allocator<int>_>::allocator_ref(local_100,alloc_00);
  check_forwarding(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  allocator_ref<mock_allocator<int>_>::allocator_ref(local_118,local_100);
  check_forwarding(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  allocator_ref<mock_allocator<int>_>::allocator_ref(&local_120,(mock_allocator<int> *)0x0);
  actual_expression = allocator_ref<mock_allocator<int>_>::get(&local_120);
  testing::internal::EqHelper<true>::Compare<mock_allocator<int>>
            ((char *)alloc_00,(char *)actual_expression,
             (Secret *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
             (mock_allocator<int> *)in_stack_fffffffffffffea0);
  line = (int)((ulong)alloc_00 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffed0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffed0);
    in_stack_fffffffffffffea0 =
         (StrictMock<mock_allocator<int>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x123a3c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,(char *)in_stack_fffffffffffffec0
               ,line,(char *)actual_expression);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
    testing::Message::~Message((Message *)0x123a8a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x123aca);
  allocator_ref<mock_allocator<int>_>::operator=(&local_120,local_100);
  check_forwarding(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  testing::StrictMock<mock_allocator<int>_>::~StrictMock(in_stack_fffffffffffffea0);
  return;
}

Assistant:

TEST(AllocatorTest, allocator_ref) {
  StrictMock< mock_allocator<int> > alloc;
  typedef allocator_ref< mock_allocator<int> > test_allocator_ref;
  test_allocator_ref ref(&alloc);
  // Check if allocator_ref forwards to the underlying allocator.
  check_forwarding(alloc, ref);
  test_allocator_ref ref2(ref);
  check_forwarding(alloc, ref2);
  test_allocator_ref ref3;
  EXPECT_EQ(FMT_NULL, ref3.get());
  ref3 = ref;
  check_forwarding(alloc, ref3);
}